

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * wasm::read_stdin(void)

{
  iterator __position;
  bool bVar1;
  undefined8 in_RAX;
  long *plVar2;
  vector<char,std::allocator<char>> *in_RDI;
  undefined8 uStack_28;
  char c;
  
  uStack_28 = in_RAX;
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Loading stdin...\n",0x11);
  }
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)&std::cin);
    if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) ||
       (((byte)std::__cxx11::string::insert[*(long *)(std::cin + -0x18)] & 2) != 0)) break;
    __position._M_current = *(char **)(in_RDI + 8);
    if (__position._M_current == *(char **)(in_RDI + 0x10)) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                (in_RDI,__position,(char *)((long)&uStack_28 + 7));
    }
    else {
      *__position._M_current = uStack_28._7_1_;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    }
  }
  return (vector<char,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::vector<char> wasm::read_stdin() {
  BYN_TRACE("Loading stdin...\n");
  std::vector<char> input;
  char c;
  while (std::cin.get(c) && !std::cin.eof()) {
    input.push_back(c);
  }
  return input;
}